

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters_task
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,uint64 data,void *pData_ptr)

{
  crn_thread_id_t cVar1;
  vector<unsigned_int> *pvVar2;
  uint *puVar3;
  long lVar4;
  long *plVar5;
  crn_thread_id_t cVar6;
  code *pProgress_callback;
  vector<unsigned_int> *pvVar7;
  ulong uVar8;
  ulong uVar9;
  clusterizer<crnlib::vec<16U,_float>_> *this_00;
  
  if (this->m_canceled == false) {
    this_00 = this->m_clusterizers + (data & 0xffffffff);
    clusterizer<crnlib::vec<16U,_float>_>::clear(this_00);
    plVar5 = *(long **)((long)pData_ptr + 8);
    if ((int)plVar5[1] != 0) {
      uVar9 = 0;
      do {
        lVar4 = (ulong)*(uint *)(*plVar5 + uVar9 * 4) * 0x44;
        clusterizer<crnlib::vec<16U,_float>_>::add_training_vec
                  (this_00,(vec<16U,_float> *)(**pData_ptr + lVar4),
                   *(uint *)(**pData_ptr + 0x40 + lVar4));
        uVar9 = uVar9 + 1;
        plVar5 = *(long **)((long)pData_ptr + 8);
      } while (uVar9 < *(uint *)(plVar5 + 1));
    }
    if (this->m_canceled == false) {
      cVar6 = crn_get_current_thread_id();
      cVar1 = this->m_main_thread_id;
      if ((cVar6 == cVar1) && (this->m_cluster_task_displayed_progress != true)) {
        pProgress_callback = generate_codebook_progress_callback;
      }
      else {
        pProgress_callback = generate_codebook_dummy_progress_callback;
      }
      clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
                (this_00,*(uint *)((long)pData_ptr + 0x20),pProgress_callback,this,false);
      if (cVar6 == cVar1) {
        this->m_cluster_task_displayed_progress = true;
      }
      if (this->m_canceled == false) {
        clusterizer<crnlib::vec<16U,_float>_>::retrieve_clusters
                  (this_00,this->m_clusterizers[data & 0xffffffff].m_codebook.m_size,
                   (vector<crnlib::vector<unsigned_int>_> *)((long)pData_ptr + 0x10));
        if (*(int *)((long)pData_ptr + 0x18) != 0) {
          pvVar2 = ((vector<crnlib::vector<unsigned_int>_> *)((long)pData_ptr + 0x10))->m_p;
          uVar9 = 0;
          do {
            if (pvVar2[uVar9].m_size != 0) {
              pvVar7 = pvVar2 + uVar9;
              puVar3 = pvVar7->m_p;
              lVar4 = **(long **)((long)pData_ptr + 8);
              uVar8 = 0;
              do {
                puVar3[uVar8] = *(uint *)(lVar4 + (ulong)puVar3[uVar8] * 4);
                uVar8 = uVar8 + 1;
              } while (uVar8 < pvVar7->m_size);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < *(uint *)((long)pData_ptr + 0x18));
        }
      }
    }
  }
  return;
}

Assistant:

void create_clusters_task(uint64 data, void* pData_ptr)
        {
            if (m_canceled)
            {
                return;
            }

            const uint partition_index = static_cast<uint>(data);
            create_clusters_task_state& state = *static_cast<create_clusters_task_state*>(pData_ptr);

            m_clusterizers[partition_index].clear();

            for (uint i = 0; i < state.m_pIndices->size(); i++)
            {
                const uint index = (*state.m_pIndices)[i];
                const weighted_vec& v = (*state.m_pWeighted_vecs)[index];

                m_clusterizers[partition_index].add_training_vec(v.m_vec, v.m_weight);
            }

            if (m_canceled)
            {
                return;
            }

            const bool is_main_thread = (crn_get_current_thread_id() == m_main_thread_id);

            const bool quick = false;
            m_clusterizers[partition_index].generate_codebook(
                state.m_max_clusters,
                (is_main_thread && !m_cluster_task_displayed_progress) ? generate_codebook_progress_callback : generate_codebook_dummy_progress_callback,
                this,
                quick);

            if (is_main_thread)
            {
                m_cluster_task_displayed_progress = true;
            }

            if (m_canceled)
            {
                return;
            }

            const uint num_clusters = m_clusterizers[partition_index].get_codebook_size();

            m_clusterizers[partition_index].retrieve_clusters(num_clusters, state.m_cluster_indices);

            for (uint i = 0; i < state.m_cluster_indices.size(); i++)
            {
                crnlib::vector<uint>& indices = state.m_cluster_indices[i];

                for (uint j = 0; j < indices.size(); j++)
                {
                    indices[j] = (*state.m_pIndices)[indices[j]];
                }
            }
        }